

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# txpackage_tests.cpp
# Opt level: O0

void __thiscall
txpackage_tests::package_validation_tests::test_method(package_validation_tests *this)

{
  initializer_list<std::shared_ptr<const_CTransaction>_> __l;
  initializer_list<std::shared_ptr<const_CTransaction>_> __l_00;
  bool bVar1;
  unsigned_long uVar2;
  const_reference pvVar3;
  Chainstate *pCVar4;
  undefined1 *puVar5;
  long in_FS_OFFSET;
  iterator it_giant_tx;
  Package package_single_giant;
  CTransactionRef giant_ptx;
  const_iterator it_child;
  const_iterator it_parent;
  Package package_parent_child;
  CTransactionRef tx_child;
  CMutableTransaction mtx_child;
  CKey child_key;
  CTransactionRef tx_parent;
  CMutableTransaction mtx_parent;
  CKey parent_key;
  uint initialPoolSize;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock13;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  err_single_large;
  PackageMempoolAcceptResult result_single_large;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  err_parent_child;
  PackageMempoolAcceptResult result_parent_child;
  CScript child_locking_script;
  CScript parent_locking_script;
  variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  *in_stack_fffffffffffff288;
  CKey *this_00;
  char *this_01;
  PKHash *in_stack_fffffffffffff290;
  CMutableTransaction *txIn;
  char *this_02;
  CTxMemPool *in_stack_fffffffffffff298;
  uint uVar6;
  variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  *this_03;
  char *this_04;
  undefined4 in_stack_fffffffffffff2a0;
  uint32_t in_stack_fffffffffffff2a4;
  undefined4 in_stack_fffffffffffff2a8;
  int in_stack_fffffffffffff2ac;
  undefined7 in_stack_fffffffffffff2b0;
  undefined1 in_stack_fffffffffffff2b7;
  CKey *in_stack_fffffffffffff2b8;
  lazy_ostream *in_stack_fffffffffffff2c0;
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  *in_stack_fffffffffffff2c8;
  unit_test_log_t *this_05;
  undefined7 in_stack_fffffffffffff2d0;
  undefined1 in_stack_fffffffffffff2d7;
  size_type in_stack_fffffffffffff2d8;
  optional<CFeeRate> *in_stack_fffffffffffff2f8;
  Package *in_stack_fffffffffffff300;
  undefined7 in_stack_fffffffffffff308;
  undefined1 in_stack_fffffffffffff30f;
  Chainstate *in_stack_fffffffffffff310;
  TxPackageTest *in_stack_fffffffffffff318;
  undefined8 in_stack_fffffffffffff380;
  undefined1 uVar7;
  undefined1 test_accept;
  CTxMemPool *in_stack_fffffffffffff3d8;
  ValidationState<PackageValidationResult> *in_stack_fffffffffffff3e0;
  PackageMempoolAcceptResult *in_stack_fffffffffffff3e8;
  lazy_ostream *in_stack_fffffffffffff3f0;
  undefined8 in_stack_fffffffffffff418;
  undefined7 in_stack_fffffffffffff420;
  undefined1 in_stack_fffffffffffff427;
  undefined8 in_stack_fffffffffffff428;
  CTransactionRef *in_stack_fffffffffffff430;
  TestChain100Setup *in_stack_fffffffffffff438;
  undefined1 *local_a90;
  CScript *in_stack_fffffffffffff5c0;
  CAmount in_stack_fffffffffffff5c8;
  CKey *local_a00;
  undefined1 local_9f8 [16];
  undefined1 local_9e8 [64];
  undefined1 local_9a8 [16];
  undefined1 local_998 [64];
  _Base_ptr local_958;
  undefined1 local_950 [16];
  undefined1 local_940 [64];
  ValidationState<PackageValidationResult> local_900;
  const_string local_8a8;
  lazy_ostream local_898 [2];
  assertion_result local_878 [3];
  const_string local_820 [2];
  lazy_ostream local_800 [2];
  assertion_result local_7e0 [3];
  undefined1 local_798 [16];
  undefined1 local_788 [68];
  ValidationState<PackageValidationResult> local_744;
  const_string local_6e8 [2];
  lazy_ostream local_6c8 [2];
  assertion_result local_6a8 [2];
  undefined1 local_670 [16];
  undefined1 local_660 [68];
  ValidationState<PackageValidationResult> local_61c;
  const_string local_5c0 [2];
  lazy_ostream local_5a0 [2];
  assertion_result local_580 [2];
  _Base_ptr local_548;
  _Base_ptr local_540;
  const_string local_538;
  lazy_ostream local_528 [2];
  assertion_result local_508 [13];
  ValidationState<PackageValidationResult> local_3bc;
  undefined1 local_368 [192];
  undefined1 local_2a8 [16];
  undefined1 local_298 [160];
  undefined1 local_1f8 [32];
  CTransaction local_1d8;
  CKey local_f0 [14];
  long local_8;
  
  uVar7 = (undefined1)((ulong)in_stack_fffffffffffff418 >> 0x38);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  MaybeCheckNotHeld<AnnotatedMixin<std::recursive_mutex>>
            ((AnnotatedMixin<std::recursive_mutex> *)in_stack_fffffffffffff288);
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)in_stack_fffffffffffff2c8,
             (AnnotatedMixin<std::recursive_mutex> *)in_stack_fffffffffffff2c0,
             &in_stack_fffffffffffff2b8->fCompressed,
             (char *)CONCAT17(in_stack_fffffffffffff2b7,in_stack_fffffffffffff2b0),
             in_stack_fffffffffffff2ac,SUB41((uint)in_stack_fffffffffffff2a8 >> 0x18,0));
  std::unique_ptr<CTxMemPool,_std::default_delete<CTxMemPool>_>::operator->
            ((unique_ptr<CTxMemPool,_std::default_delete<CTxMemPool>_> *)in_stack_fffffffffffff288);
  uVar2 = CTxMemPool::size(in_stack_fffffffffffff298);
  local_3bc.m_mode = (ModeState)uVar2;
  GenerateRandomKey(SUB81((ulong)in_stack_fffffffffffff290 >> 0x38,0));
  CKey::GetPubKey((CKey *)CONCAT17(in_stack_fffffffffffff2b7,in_stack_fffffffffffff2b0));
  PKHash::PKHash((PKHash *)CONCAT44(in_stack_fffffffffffff2a4,in_stack_fffffffffffff2a0),
                 (CPubKey *)in_stack_fffffffffffff298);
  std::
  variant<CNoDestination,PubKeyDestination,PKHash,ScriptHash,WitnessV0ScriptHash,WitnessV0KeyHash,WitnessV1Taproot,PayToAnchor,WitnessUnknown>
  ::variant<PKHash,void,void,PKHash,void>
            ((variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
              *)in_stack_fffffffffffff298,in_stack_fffffffffffff290);
  GetScriptForDestination(in_stack_fffffffffffff288);
  std::
  variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  ::~variant(in_stack_fffffffffffff288);
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::operator[]((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                *)in_stack_fffffffffffff298,(size_type)in_stack_fffffffffffff290);
  uVar6 = (uint)((ulong)in_stack_fffffffffffff298 >> 0x20);
  std::shared_ptr<const_CTransaction>::shared_ptr
            ((shared_ptr<const_CTransaction> *)in_stack_fffffffffffff288,
             (shared_ptr<const_CTransaction> *)0xb633ca);
  CKey::CKey(in_stack_fffffffffffff2b8,
             (CKey *)CONCAT17(in_stack_fffffffffffff2b7,in_stack_fffffffffffff2b0));
  CScript::CScript((CScript *)in_stack_fffffffffffff288,(CScript *)0xb633fd);
  txIn = (CMutableTransaction *)&DAT_124101100;
  this_00 = local_f0;
  this_03 = (variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
             *)((ulong)uVar6 << 0x20);
  TestChain100Setup::CreateValidMempoolTransaction
            (in_stack_fffffffffffff438,in_stack_fffffffffffff430,
             (uint32_t)((ulong)in_stack_fffffffffffff428 >> 0x20),(int)in_stack_fffffffffffff428,
             (CKey *)CONCAT17(in_stack_fffffffffffff427,in_stack_fffffffffffff420),
             in_stack_fffffffffffff5c0,in_stack_fffffffffffff5c8,(bool)uVar7);
  CScript::~CScript((CScript *)this_00);
  CKey::~CKey(this_00);
  std::shared_ptr<const_CTransaction>::~shared_ptr((shared_ptr<const_CTransaction> *)this_00);
  MakeTransactionRef<CMutableTransaction&>(txIn);
  GenerateRandomKey(SUB81((ulong)txIn >> 0x38,0));
  CKey::GetPubKey((CKey *)CONCAT17(in_stack_fffffffffffff2b7,in_stack_fffffffffffff2b0));
  PKHash::PKHash((PKHash *)CONCAT44(in_stack_fffffffffffff2a4,in_stack_fffffffffffff2a0),
                 (CPubKey *)this_03);
  std::
  variant<CNoDestination,PubKeyDestination,PKHash,ScriptHash,WitnessV0ScriptHash,WitnessV0KeyHash,WitnessV1Taproot,PayToAnchor,WitnessUnknown>
  ::variant<PKHash,void,void,PKHash,void>(this_03,(PKHash *)txIn);
  GetScriptForDestination((CTxDestination *)this_00);
  std::
  variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  ::~variant((variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
              *)this_00);
  std::shared_ptr<const_CTransaction>::shared_ptr
            ((shared_ptr<const_CTransaction> *)this_00,(shared_ptr<const_CTransaction> *)0xb6352b);
  CKey::CKey(in_stack_fffffffffffff2b8,
             (CKey *)CONCAT17(in_stack_fffffffffffff2b7,in_stack_fffffffffffff2b0));
  CScript::CScript((CScript *)this_00,(CScript *)0xb63557);
  this_02 = &DAT_11e1a3000;
  this_01 = local_1f8 + 0x20;
  this_04 = (char *)((ulong)this_03 & 0xffffffff00000000);
  TestChain100Setup::CreateValidMempoolTransaction
            (in_stack_fffffffffffff438,in_stack_fffffffffffff430,
             (uint32_t)((ulong)in_stack_fffffffffffff428 >> 0x20),(int)in_stack_fffffffffffff428,
             (CKey *)CONCAT17(in_stack_fffffffffffff427,in_stack_fffffffffffff420),
             in_stack_fffffffffffff5c0,in_stack_fffffffffffff5c8,(bool)uVar7);
  CScript::~CScript((CScript *)this_01);
  CKey::~CKey((CKey *)this_01);
  std::shared_ptr<const_CTransaction>::~shared_ptr((shared_ptr<const_CTransaction> *)this_01);
  MakeTransactionRef<CMutableTransaction&>((CMutableTransaction *)this_02);
  std::shared_ptr<const_CTransaction>::shared_ptr
            ((shared_ptr<const_CTransaction> *)this_01,(shared_ptr<const_CTransaction> *)0xb63606);
  std::shared_ptr<const_CTransaction>::shared_ptr
            ((shared_ptr<const_CTransaction> *)this_01,(shared_ptr<const_CTransaction> *)0xb6361b);
  std::allocator<std::shared_ptr<const_CTransaction>_>::allocator
            ((allocator<std::shared_ptr<const_CTransaction>_> *)this_01);
  __l._M_array._7_1_ = in_stack_fffffffffffff2d7;
  __l._M_array._0_7_ = in_stack_fffffffffffff2d0;
  __l._M_len = in_stack_fffffffffffff2d8;
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::vector(in_stack_fffffffffffff2c8,__l,(allocator_type *)in_stack_fffffffffffff2c0);
  std::allocator<std::shared_ptr<const_CTransaction>_>::~allocator
            ((allocator<std::shared_ptr<const_CTransaction>_> *)this_01);
  local_a90 = local_1f8 + 0x20;
  do {
    local_a90 = local_a90 + -0x10;
    std::shared_ptr<const_CTransaction>::~shared_ptr((shared_ptr<const_CTransaction> *)this_01);
    uVar7 = (undefined1)((ulong)in_stack_fffffffffffff380 >> 0x38);
  } while (local_a90 != local_1f8);
  std::unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_>::operator->
            ((unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_> *)this_01);
  ChainstateManager::ActiveChainstate((ChainstateManager *)this_04);
  std::unique_ptr<CTxMemPool,_std::default_delete<CTxMemPool>_>::operator*
            ((unique_ptr<CTxMemPool,_std::default_delete<CTxMemPool>_> *)this_04);
  std::optional<CFeeRate>::optional((optional<CFeeRate> *)this_01);
  ProcessNewPackage(in_stack_fffffffffffff310,
                    (CTxMemPool *)CONCAT17(in_stack_fffffffffffff30f,in_stack_fffffffffffff308),
                    in_stack_fffffffffffff300,(bool)uVar7,in_stack_fffffffffffff2f8);
  CheckPackageMempoolAcceptResult_abi_cxx11_
            ((Package *)in_stack_fffffffffffff3f0,in_stack_fffffffffffff3e8,
             SUB81((ulong)in_stack_fffffffffffff3e0 >> 0x38,0),in_stack_fffffffffffff3d8);
  bVar1 = std::optional::operator_cast_to_bool
                    ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)this_01);
  if (bVar1) {
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)this_04,this_02,(unsigned_long)this_01);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)this_01);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)in_stack_fffffffffffff2c8,
                 (const_string *)in_stack_fffffffffffff2c0,(size_t)in_stack_fffffffffffff2b8,
                 (const_string *)CONCAT17(in_stack_fffffffffffff2b7,in_stack_fffffffffffff2b0));
      boost::test_tools::assertion_result::assertion_result
                ((assertion_result *)this_04,SUB81((ulong)this_02 >> 0x38,0));
      boost::unit_test::lazy_ostream::instance();
      std::
      optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      value((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)this_04);
      boost::unit_test::operator<<
                ((lazy_ostream *)this_02,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_01);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)this_04,this_02,(unsigned_long)this_01);
      this_01 = (char *)0x0;
      boost::test_tools::tt_detail::report_assertion(local_508,local_528,&local_538,0xe3,CHECK);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
      ::~lazy_ostream_impl
                ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                  *)this_01);
      boost::test_tools::assertion_result::~assertion_result((assertion_result *)this_01);
      bVar1 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar1);
  }
  else {
    std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               this_01);
    CTransaction::GetWitnessHash((CTransaction *)this_01);
    transaction_identifier::operator_cast_to_uint256_((transaction_identifier<true> *)this_01);
    local_540 = (_Base_ptr)
                std::
                map<uint256,_MempoolAcceptResult,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_MempoolAcceptResult>_>_>
                ::find((map<uint256,_MempoolAcceptResult,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_MempoolAcceptResult>_>_>
                        *)this_02,(key_type *)this_01);
    std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               this_01);
    CTransaction::GetWitnessHash((CTransaction *)this_01);
    transaction_identifier::operator_cast_to_uint256_((transaction_identifier<true> *)this_01);
    local_548 = (_Base_ptr)
                std::
                map<uint256,_MempoolAcceptResult,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_MempoolAcceptResult>_>_>
                ::find((map<uint256,_MempoolAcceptResult,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_MempoolAcceptResult>_>_>
                        *)this_02,(key_type *)this_01);
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)this_04,this_02,(unsigned_long)this_01);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)this_01);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)in_stack_fffffffffffff2c8,
                 (const_string *)in_stack_fffffffffffff2c0,(size_t)in_stack_fffffffffffff2b8,
                 (const_string *)CONCAT17(in_stack_fffffffffffff2b7,in_stack_fffffffffffff2b0));
      std::_Rb_tree_const_iterator<std::pair<const_uint256,_MempoolAcceptResult>_>::operator->
                ((_Rb_tree_const_iterator<std::pair<const_uint256,_MempoolAcceptResult>_> *)this_01)
      ;
      std::optional<CFeeRate>::value((optional<CFeeRate> *)this_04);
      std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator*((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                )this_04);
      GetVirtualTransactionSize((CTransaction *)this_01);
      CFeeRate::GetFee((CFeeRate *)CONCAT44(in_stack_fffffffffffff2ac,in_stack_fffffffffffff2a8),
                       in_stack_fffffffffffff2a4);
      boost::test_tools::assertion_result::assertion_result
                ((assertion_result *)this_04,SUB81((ulong)this_02 >> 0x38,0));
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)this_04,this_02,(unsigned_long)this_01);
      boost::unit_test::operator<<((lazy_ostream *)this_02,(basic_cstring<const_char> *)this_01);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)this_04,this_02,(unsigned_long)this_01);
      this_01 = (char *)0x0;
      boost::test_tools::tt_detail::report_assertion
                (local_580,local_5a0,local_5c0,0xe8,CHECK,CHECK_PRED);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
      ::~lazy_ostream_impl
                ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                  *)this_01);
      boost::test_tools::assertion_result::~assertion_result((assertion_result *)this_01);
      bVar1 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar1);
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)this_04,this_02,(unsigned_long)this_01);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)this_01);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)in_stack_fffffffffffff2c8,
                 (const_string *)in_stack_fffffffffffff2c0,(size_t)in_stack_fffffffffffff2b8,
                 (const_string *)CONCAT17(in_stack_fffffffffffff2b7,in_stack_fffffffffffff2b0));
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::operator<<((lazy_ostream *)this_02,(char (*) [1])this_01);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)this_04,this_02,(unsigned_long)this_01);
      std::_Rb_tree_const_iterator<std::pair<const_uint256,_MempoolAcceptResult>_>::operator->
                ((_Rb_tree_const_iterator<std::pair<const_uint256,_MempoolAcceptResult>_> *)this_01)
      ;
      std::
      optional<std::vector<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>_>
      ::value((optional<std::vector<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>_>
               *)this_04);
      local_61c._4_8_ =
           std::vector<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
           ::size((vector<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
                   *)this_01);
      local_61c.m_mode = M_INVALID;
      this_04 = "1";
      this_02 = (char *)&local_61c;
      this_01 = "it_parent->second.m_wtxids_fee_calculations.value().size()";
      boost::test_tools::tt_detail::
      check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,int>
                ((undefined1 *)((long)&local_61c.m_reject_reason.field_2 + 4),
                 (undefined1 *)((long)&local_61c.m_reject_reason._M_dataplus._M_p + 4),0xe9,1,2,
                 &local_61c.m_result);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>::
      ~lazy_ostream_impl((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
                          *)this_01);
      bVar1 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar1);
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)this_04,this_02,(unsigned_long)this_01);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)this_01);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)in_stack_fffffffffffff2c8,
                 (const_string *)in_stack_fffffffffffff2c0,(size_t)in_stack_fffffffffffff2b8,
                 (const_string *)CONCAT17(in_stack_fffffffffffff2b7,in_stack_fffffffffffff2b0));
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::operator<<((lazy_ostream *)this_02,(char (*) [1])this_01);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)this_04,this_02,(unsigned_long)this_01);
      std::_Rb_tree_const_iterator<std::pair<const_uint256,_MempoolAcceptResult>_>::operator->
                ((_Rb_tree_const_iterator<std::pair<const_uint256,_MempoolAcceptResult>_> *)this_01)
      ;
      std::
      optional<std::vector<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>_>
      ::value((optional<std::vector<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>_>
               *)this_04);
      pvVar3 = std::
               vector<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
               ::front((vector<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
                        *)this_02);
      std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)this_01);
      this_02 = (char *)CTransaction::GetWitnessHash((CTransaction *)this_01);
      this_04 = "tx_parent->GetWitnessHash()";
      this_01 = "it_parent->second.m_wtxids_fee_calculations.value().front()";
      boost::test_tools::tt_detail::
      check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,transaction_identifier<true>,transaction_identifier<true>>
                (local_660,local_670,0xea,1,2,pvVar3);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>::
      ~lazy_ostream_impl((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
                          *)this_01);
      bVar1 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar1);
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)this_04,this_02,(unsigned_long)this_01);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)this_01);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)in_stack_fffffffffffff2c8,
                 (const_string *)in_stack_fffffffffffff2c0,(size_t)in_stack_fffffffffffff2b8,
                 (const_string *)CONCAT17(in_stack_fffffffffffff2b7,in_stack_fffffffffffff2b0));
      std::_Rb_tree_const_iterator<std::pair<const_uint256,_MempoolAcceptResult>_>::operator->
                ((_Rb_tree_const_iterator<std::pair<const_uint256,_MempoolAcceptResult>_> *)this_01)
      ;
      std::optional<CFeeRate>::value((optional<CFeeRate> *)this_04);
      std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator*((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                )this_04);
      GetVirtualTransactionSize((CTransaction *)this_01);
      CFeeRate::GetFee((CFeeRate *)CONCAT44(in_stack_fffffffffffff2ac,in_stack_fffffffffffff2a8),
                       in_stack_fffffffffffff2a4);
      boost::test_tools::assertion_result::assertion_result
                ((assertion_result *)this_04,SUB81((ulong)this_02 >> 0x38,0));
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)this_04,this_02,(unsigned_long)this_01);
      boost::unit_test::operator<<((lazy_ostream *)this_02,(basic_cstring<const_char> *)this_01);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)this_04,this_02,(unsigned_long)this_01);
      this_01 = (char *)0x0;
      boost::test_tools::tt_detail::report_assertion
                (local_6a8,local_6c8,local_6e8,0xec,CHECK,CHECK_PRED);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
      ::~lazy_ostream_impl
                ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                  *)this_01);
      boost::test_tools::assertion_result::~assertion_result((assertion_result *)this_01);
      bVar1 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar1);
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)this_04,this_02,(unsigned_long)this_01);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)this_01);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)in_stack_fffffffffffff2c8,
                 (const_string *)in_stack_fffffffffffff2c0,(size_t)in_stack_fffffffffffff2b8,
                 (const_string *)CONCAT17(in_stack_fffffffffffff2b7,in_stack_fffffffffffff2b0));
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::operator<<((lazy_ostream *)this_02,(char (*) [1])this_01);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)this_04,this_02,(unsigned_long)this_01);
      std::_Rb_tree_const_iterator<std::pair<const_uint256,_MempoolAcceptResult>_>::operator->
                ((_Rb_tree_const_iterator<std::pair<const_uint256,_MempoolAcceptResult>_> *)this_01)
      ;
      std::
      optional<std::vector<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>_>
      ::value((optional<std::vector<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>_>
               *)this_04);
      local_744._4_8_ =
           std::vector<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
           ::size((vector<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
                   *)this_01);
      local_744.m_mode = M_INVALID;
      this_04 = "1";
      this_02 = (char *)&local_744;
      this_01 = "it_child->second.m_wtxids_fee_calculations.value().size()";
      boost::test_tools::tt_detail::
      check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,int>
                ((undefined1 *)((long)&local_744.m_reject_reason.field_2 + 4),
                 (undefined1 *)((long)&local_744.m_reject_reason._M_dataplus._M_p + 4),0xed,1,2,
                 &local_744.m_result);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>::
      ~lazy_ostream_impl((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
                          *)this_01);
      bVar1 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar1);
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)this_04,this_02,(unsigned_long)this_01);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)this_01);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)in_stack_fffffffffffff2c8,
                 (const_string *)in_stack_fffffffffffff2c0,(size_t)in_stack_fffffffffffff2b8,
                 (const_string *)CONCAT17(in_stack_fffffffffffff2b7,in_stack_fffffffffffff2b0));
      in_stack_fffffffffffff3f0 = boost::unit_test::lazy_ostream::instance();
      boost::unit_test::operator<<((lazy_ostream *)this_02,(char (*) [1])this_01);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)this_04,this_02,(unsigned_long)this_01);
      std::_Rb_tree_const_iterator<std::pair<const_uint256,_MempoolAcceptResult>_>::operator->
                ((_Rb_tree_const_iterator<std::pair<const_uint256,_MempoolAcceptResult>_> *)this_01)
      ;
      in_stack_fffffffffffff3e8 =
           (PackageMempoolAcceptResult *)
           std::
           optional<std::vector<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>_>
           ::value((optional<std::vector<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>_>
                    *)this_04);
      in_stack_fffffffffffff3d8 =
           (CTxMemPool *)
           std::vector<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
           ::front((vector<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
                    *)this_02);
      std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)this_01);
      this_02 = (char *)CTransaction::GetWitnessHash((CTransaction *)this_01);
      this_04 = "tx_child->GetWitnessHash()";
      this_01 = "it_child->second.m_wtxids_fee_calculations.value().front()";
      in_stack_fffffffffffff3e0 = (ValidationState<PackageValidationResult> *)this_02;
      boost::test_tools::tt_detail::
      check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,transaction_identifier<true>,transaction_identifier<true>>
                (local_788,local_798,0xee,1,2,in_stack_fffffffffffff3d8);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>::
      ~lazy_ostream_impl((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
                          *)this_01);
      bVar1 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar1);
  }
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~optional((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)this_01);
  TxPackageTest::create_placeholder_tx
            (in_stack_fffffffffffff318,(size_t)in_stack_fffffffffffff310,
             CONCAT17(in_stack_fffffffffffff30f,in_stack_fffffffffffff308));
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)this_04,this_02,(unsigned_long)this_01);
    boost::unit_test::basic_cstring<const_char>::basic_cstring((basic_cstring<const_char> *)this_01)
    ;
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffff2c8,
               (const_string *)in_stack_fffffffffffff2c0,(size_t)in_stack_fffffffffffff2b8,
               (const_string *)CONCAT17(in_stack_fffffffffffff2b7,in_stack_fffffffffffff2b0));
    std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator*((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
              this_04);
    GetVirtualTransactionSize((CTransaction *)this_01);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)this_04,SUB81((ulong)this_02 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)this_04,this_02,(unsigned_long)this_01);
    boost::unit_test::operator<<((lazy_ostream *)this_02,(basic_cstring<const_char> *)this_01);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)this_04,this_02,(unsigned_long)this_01);
    this_01 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_7e0,local_800,local_820,0xf2,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)this_01);
    boost::test_tools::assertion_result::~assertion_result((assertion_result *)this_01);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  std::shared_ptr<const_CTransaction>::shared_ptr
            ((shared_ptr<const_CTransaction> *)this_01,(shared_ptr<const_CTransaction> *)0xb64927);
  std::allocator<std::shared_ptr<const_CTransaction>_>::allocator
            ((allocator<std::shared_ptr<const_CTransaction>_> *)this_01);
  __l_00._M_array._7_1_ = in_stack_fffffffffffff2d7;
  __l_00._M_array._0_7_ = in_stack_fffffffffffff2d0;
  __l_00._M_len = in_stack_fffffffffffff2d8;
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::vector(in_stack_fffffffffffff2c8,__l_00,(allocator_type *)in_stack_fffffffffffff2c0);
  std::allocator<std::shared_ptr<const_CTransaction>_>::~allocator
            ((allocator<std::shared_ptr<const_CTransaction>_> *)this_01);
  puVar5 = local_298;
  do {
    puVar5 = puVar5 + -0x10;
    std::shared_ptr<const_CTransaction>::~shared_ptr((shared_ptr<const_CTransaction> *)this_01);
    uVar7 = (undefined1)((ulong)in_stack_fffffffffffff3e0 >> 0x38);
  } while (puVar5 != local_2a8);
  std::unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_>::operator->
            ((unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_> *)this_01);
  pCVar4 = ChainstateManager::ActiveChainstate((ChainstateManager *)this_04);
  test_accept = (undefined1)((ulong)pCVar4 >> 0x38);
  std::unique_ptr<CTxMemPool,_std::default_delete<CTxMemPool>_>::operator*
            ((unique_ptr<CTxMemPool,_std::default_delete<CTxMemPool>_> *)this_04);
  std::optional<CFeeRate>::optional((optional<CFeeRate> *)this_01);
  ProcessNewPackage(in_stack_fffffffffffff310,
                    (CTxMemPool *)CONCAT17(in_stack_fffffffffffff30f,in_stack_fffffffffffff308),
                    in_stack_fffffffffffff300,(bool)test_accept,in_stack_fffffffffffff2f8);
  CheckPackageMempoolAcceptResult_abi_cxx11_
            ((Package *)in_stack_fffffffffffff3f0,in_stack_fffffffffffff3e8,(bool)uVar7,
             in_stack_fffffffffffff3d8);
  bVar1 = std::optional::operator_cast_to_bool
                    ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)this_01);
  if (bVar1) {
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)this_04,this_02,(unsigned_long)this_01);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)this_01);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)in_stack_fffffffffffff2c8,
                 (const_string *)in_stack_fffffffffffff2c0,(size_t)in_stack_fffffffffffff2b8,
                 (const_string *)CONCAT17(in_stack_fffffffffffff2b7,in_stack_fffffffffffff2b0));
      boost::test_tools::assertion_result::assertion_result
                ((assertion_result *)this_04,SUB81((ulong)this_02 >> 0x38,0));
      boost::unit_test::lazy_ostream::instance();
      std::
      optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      value((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)this_04);
      boost::unit_test::operator<<
                ((lazy_ostream *)this_02,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_01);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)this_04,this_02,(unsigned_long)this_01);
      this_01 = (char *)0x0;
      boost::test_tools::tt_detail::report_assertion(local_878,local_898,&local_8a8,0xf6,CHECK);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
      ::~lazy_ostream_impl
                ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                  *)this_01);
      boost::test_tools::assertion_result::~assertion_result((assertion_result *)this_01);
      bVar1 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar1);
  }
  else {
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)this_04,this_02,(unsigned_long)this_01);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)this_01);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)in_stack_fffffffffffff2c8,
                 (const_string *)in_stack_fffffffffffff2c0,(size_t)in_stack_fffffffffffff2b8,
                 (const_string *)CONCAT17(in_stack_fffffffffffff2b7,in_stack_fffffffffffff2b0));
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::operator<<((lazy_ostream *)this_02,(char (*) [1])this_01);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)this_04,this_02,(unsigned_long)this_01);
      local_900.m_result =
           ValidationState<PackageValidationResult>::GetResult
                     ((ValidationState<PackageValidationResult> *)this_01);
      local_900.m_mode = M_ERROR;
      this_04 = "PackageValidationResult::PCKG_TX";
      this_02 = (char *)&local_900;
      this_01 = "result_single_large.m_state.GetResult()";
      boost::test_tools::tt_detail::
      check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,PackageValidationResult,PackageValidationResult>
                (&local_900.m_reject_reason.field_2,&local_900.m_reject_reason,0xf8,1,2,
                 &local_900.m_result);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>::
      ~lazy_ostream_impl((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
                          *)this_01);
      bVar1 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar1);
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)this_04,this_02,(unsigned_long)this_01);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)this_01);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)in_stack_fffffffffffff2c8,
                 (const_string *)in_stack_fffffffffffff2c0,(size_t)in_stack_fffffffffffff2b8,
                 (const_string *)CONCAT17(in_stack_fffffffffffff2b7,in_stack_fffffffffffff2b0));
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::operator<<((lazy_ostream *)this_02,(char (*) [1])this_01);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)this_04,this_02,(unsigned_long)this_01);
      ValidationState<PackageValidationResult>::GetRejectReason_abi_cxx11_
                ((ValidationState<PackageValidationResult> *)this_02);
      this_04 = "\"transaction failed\"";
      this_02 = "transaction failed";
      this_01 = "result_single_large.m_state.GetRejectReason()";
      boost::test_tools::tt_detail::
      check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[19]>
                (local_940,local_950,0xf9,1,2,local_368);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_01);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>::
      ~lazy_ostream_impl((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
                          *)this_01);
      bVar1 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar1);
    std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               this_01);
    CTransaction::GetWitnessHash((CTransaction *)this_01);
    transaction_identifier::operator_cast_to_uint256_((transaction_identifier<true> *)this_01);
    local_958 = (_Base_ptr)
                std::
                map<uint256,_MempoolAcceptResult,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_MempoolAcceptResult>_>_>
                ::find((map<uint256,_MempoolAcceptResult,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_MempoolAcceptResult>_>_>
                        *)this_02,(key_type *)this_01);
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)this_04,this_02,(unsigned_long)this_01);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)this_01);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)in_stack_fffffffffffff2c8,
                 (const_string *)in_stack_fffffffffffff2c0,(size_t)in_stack_fffffffffffff2b8,
                 (const_string *)CONCAT17(in_stack_fffffffffffff2b7,in_stack_fffffffffffff2b0));
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::operator<<((lazy_ostream *)this_02,(char (*) [1])this_01);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)this_04,this_02,(unsigned_long)this_01);
      std::_Rb_tree_iterator<std::pair<const_uint256,_MempoolAcceptResult>_>::operator->
                ((_Rb_tree_iterator<std::pair<const_uint256,_MempoolAcceptResult>_> *)this_01);
      ValidationState<TxValidationResult>::GetRejectReason_abi_cxx11_
                ((ValidationState<TxValidationResult> *)this_02);
      this_04 = "\"tx-size\"";
      this_02 = "tx-size";
      this_01 = "it_giant_tx->second.m_state.GetRejectReason()";
      boost::test_tools::tt_detail::
      check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[8]>
                (local_998,local_9a8,0xfb,1,2,
                 (undefined1 *)((long)&local_3bc.m_debug_message._M_string_length + 4));
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_01);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>::
      ~lazy_ostream_impl((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
                          *)this_01);
      bVar1 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar1);
  }
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~optional((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)this_01);
  do {
    this_05 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)this_04,this_02,(unsigned_long)this_01);
    boost::unit_test::basic_cstring<const_char>::basic_cstring((basic_cstring<const_char> *)this_01)
    ;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (this_05,(const_string *)in_stack_fffffffffffff2c0,(size_t)in_stack_fffffffffffff2b8,
               (const_string *)CONCAT17(in_stack_fffffffffffff2b7,in_stack_fffffffffffff2b0));
    in_stack_fffffffffffff2c0 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<((lazy_ostream *)this_02,(char (*) [1])this_01);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)this_04,this_02,(unsigned_long)this_01);
    std::unique_ptr<CTxMemPool,_std::default_delete<CTxMemPool>_>::operator->
              ((unique_ptr<CTxMemPool,_std::default_delete<CTxMemPool>_> *)this_01);
    in_stack_fffffffffffff2b8 = (CKey *)CTxMemPool::size((CTxMemPool *)this_04);
    this_04 = "initialPoolSize";
    this_02 = (char *)&local_3bc;
    this_01 = "m_node.mempool->size()";
    local_a00 = in_stack_fffffffffffff2b8;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_int>
              (local_9e8,local_9f8,0xff,1,2,&local_a00);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               this_01);
    in_stack_fffffffffffff2b7 = boost::test_tools::tt_detail::dummy_cond();
  } while ((bool)in_stack_fffffffffffff2b7);
  PackageMempoolAcceptResult::~PackageMempoolAcceptResult((PackageMempoolAcceptResult *)this_01);
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::~vector((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
             *)this_04);
  std::shared_ptr<const_CTransaction>::~shared_ptr((shared_ptr<const_CTransaction> *)this_01);
  PackageMempoolAcceptResult::~PackageMempoolAcceptResult((PackageMempoolAcceptResult *)this_01);
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::~vector((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
             *)this_04);
  std::shared_ptr<const_CTransaction>::~shared_ptr((shared_ptr<const_CTransaction> *)this_01);
  CMutableTransaction::~CMutableTransaction((CMutableTransaction *)this_01);
  CScript::~CScript((CScript *)this_01);
  CKey::~CKey((CKey *)this_01);
  std::shared_ptr<const_CTransaction>::~shared_ptr((shared_ptr<const_CTransaction> *)this_01);
  CMutableTransaction::~CMutableTransaction((CMutableTransaction *)this_01);
  CScript::~CScript((CScript *)this_01);
  CKey::~CKey((CKey *)this_01);
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::~UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)this_01);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(package_validation_tests)
{
    LOCK(cs_main);
    unsigned int initialPoolSize = m_node.mempool->size();

    // Parent and Child Package
    CKey parent_key = GenerateRandomKey();
    CScript parent_locking_script = GetScriptForDestination(PKHash(parent_key.GetPubKey()));
    auto mtx_parent = CreateValidMempoolTransaction(/*input_transaction=*/m_coinbase_txns[0], /*input_vout=*/0,
                                                    /*input_height=*/0, /*input_signing_key=*/coinbaseKey,
                                                    /*output_destination=*/parent_locking_script,
                                                    /*output_amount=*/CAmount(49 * COIN), /*submit=*/false);
    CTransactionRef tx_parent = MakeTransactionRef(mtx_parent);

    CKey child_key = GenerateRandomKey();
    CScript child_locking_script = GetScriptForDestination(PKHash(child_key.GetPubKey()));
    auto mtx_child = CreateValidMempoolTransaction(/*input_transaction=*/tx_parent, /*input_vout=*/0,
                                                   /*input_height=*/101, /*input_signing_key=*/parent_key,
                                                   /*output_destination=*/child_locking_script,
                                                   /*output_amount=*/CAmount(48 * COIN), /*submit=*/false);
    CTransactionRef tx_child = MakeTransactionRef(mtx_child);
    Package package_parent_child{tx_parent, tx_child};
    const auto result_parent_child = ProcessNewPackage(m_node.chainman->ActiveChainstate(), *m_node.mempool, package_parent_child, /*test_accept=*/true, /*client_maxfeerate=*/{});
    if (auto err_parent_child{CheckPackageMempoolAcceptResult(package_parent_child, result_parent_child, /*expect_valid=*/true, nullptr)}) {
        BOOST_ERROR(err_parent_child.value());
    } else {
        auto it_parent = result_parent_child.m_tx_results.find(tx_parent->GetWitnessHash());
        auto it_child = result_parent_child.m_tx_results.find(tx_child->GetWitnessHash());

        BOOST_CHECK(it_parent->second.m_effective_feerate.value().GetFee(GetVirtualTransactionSize(*tx_parent)) == COIN);
        BOOST_CHECK_EQUAL(it_parent->second.m_wtxids_fee_calculations.value().size(), 1);
        BOOST_CHECK_EQUAL(it_parent->second.m_wtxids_fee_calculations.value().front(), tx_parent->GetWitnessHash());

        BOOST_CHECK(it_child->second.m_effective_feerate.value().GetFee(GetVirtualTransactionSize(*tx_child)) == COIN);
        BOOST_CHECK_EQUAL(it_child->second.m_wtxids_fee_calculations.value().size(), 1);
        BOOST_CHECK_EQUAL(it_child->second.m_wtxids_fee_calculations.value().front(), tx_child->GetWitnessHash());
    }
    // A single, giant transaction submitted through ProcessNewPackage fails on single tx policy.
    CTransactionRef giant_ptx = create_placeholder_tx(999, 999);
    BOOST_CHECK(GetVirtualTransactionSize(*giant_ptx) > DEFAULT_ANCESTOR_SIZE_LIMIT_KVB * 1000);
    Package package_single_giant{giant_ptx};
    auto result_single_large = ProcessNewPackage(m_node.chainman->ActiveChainstate(), *m_node.mempool, package_single_giant, /*test_accept=*/true, /*client_maxfeerate=*/{});
    if (auto err_single_large{CheckPackageMempoolAcceptResult(package_single_giant, result_single_large, /*expect_valid=*/false, nullptr)}) {
        BOOST_ERROR(err_single_large.value());
    } else {
        BOOST_CHECK_EQUAL(result_single_large.m_state.GetResult(), PackageValidationResult::PCKG_TX);
        BOOST_CHECK_EQUAL(result_single_large.m_state.GetRejectReason(), "transaction failed");
        auto it_giant_tx = result_single_large.m_tx_results.find(giant_ptx->GetWitnessHash());
        BOOST_CHECK_EQUAL(it_giant_tx->second.m_state.GetRejectReason(), "tx-size");
    }

    // Check that mempool size hasn't changed.
    BOOST_CHECK_EQUAL(m_node.mempool->size(), initialPoolSize);
}